

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O1

void wiz_light(chunk *c,player *p,_Bool full)

{
  uint32_t *puVar1;
  byte *pbVar2;
  player_upkeep *ppVar3;
  _Bool _Var4;
  loc lVar5;
  loc grid;
  square *psVar6;
  int iVar7;
  int x;
  long lVar8;
  int local_40;
  
  if (L'\x02' < c->height) {
    local_40 = 1;
    do {
      if (L'\x02' < c->width) {
        iVar7 = 1;
        do {
          lVar5 = (loc)loc(iVar7,local_40);
          _Var4 = square_seemslikewall((chunk_conflict *)c,lVar5);
          if (_Var4) {
LAB_00125188:
            if (full) {
              square_know_pile((chunk_conflict *)c,lVar5,(_func__Bool_object_ptr *)0x0);
            }
            else {
              square_sense_pile((chunk_conflict *)c,lVar5,(_func__Bool_object_ptr *)0x0);
            }
            _Var4 = square_ismark((chunk_conflict *)c,lVar5);
            if (!_Var4) {
              _Var4 = square_ismemorybad((chunk_conflict *)c,lVar5);
              if (_Var4) {
                square_forget((chunk_conflict *)c,lVar5);
              }
            }
          }
          else {
            _Var4 = square_in_bounds_fully((chunk_conflict *)c,lVar5);
            if (_Var4) {
              lVar8 = 0;
              do {
                grid = (loc)loc_sum((loc_conflict)lVar5,(loc_conflict)ddgrid_ddd[lVar8]);
                psVar6 = square((chunk_conflict *)c,grid);
                flag_on_dbg(psVar6->info,3,2,"square(c, a_grid)->info","SQUARE_GLOW");
                _Var4 = square_isfloor((chunk_conflict *)c,grid);
                if (_Var4) {
                  _Var4 = square_isvisibletrap((chunk_conflict *)c,grid);
                  if (_Var4) goto LAB_00125169;
                }
                else {
LAB_00125169:
                  square_memorize((chunk_conflict *)c,grid);
                  square_mark((chunk_conflict *)c,grid);
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 != 9);
              goto LAB_00125188;
            }
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < c->width + L'\xffffffff');
      }
      local_40 = local_40 + 1;
    } while (local_40 < c->height + L'\xffffffff');
  }
  if (L'\x02' < c->height) {
    iVar7 = 1;
    do {
      if (L'\x02' < c->width) {
        x = 1;
        do {
          lVar5 = (loc)loc(x,iVar7);
          _Var4 = square_in_bounds((chunk_conflict *)c,lVar5);
          if (_Var4) {
            square_unmark((chunk_conflict *)c,lVar5);
          }
          x = x + 1;
        } while (x < c->width + L'\xffffffff');
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < c->height + L'\xffffffff');
  }
  ppVar3 = p->upkeep;
  puVar1 = &ppVar3->update;
  *puVar1 = *puVar1 | 0xc0;
  pbVar2 = (byte *)((long)&ppVar3->redraw + 2);
  *pbVar2 = *pbVar2 | 0xc1;
  return;
}

Assistant:

void wiz_light(struct chunk *c, struct player *p, bool full)
{
	int i, y, x;

	/* Scan all grids */
	for (y = 1; y < c->height - 1; y++) {
		for (x = 1; x < c->width - 1; x++) {
			struct loc grid = loc(x, y);

			/* Process all non-walls */
			if (!square_seemslikewall(c, grid)) {
				if (!square_in_bounds_fully(c, grid)) continue;

				/* Scan all neighbors */
				for (i = 0; i < 9; i++) {
					struct loc a_grid = loc_sum(grid, ddgrid_ddd[i]);

					/* Perma-light the grid */
					sqinfo_on(square(c, a_grid)->info, SQUARE_GLOW);

					/* Memorize normal features */
					if (!square_isfloor(c, a_grid) || 
						square_isvisibletrap(c, a_grid)) {
						square_memorize(c, a_grid);
						square_mark(c, a_grid);
					}
				}
			}

			/* Memorize objects */
			if (full) {
				square_know_pile(c, grid, NULL);
			} else {
				square_sense_pile(c, grid, NULL);
			}

			/*
			 * Forget grids that are both unprocessed and
			 * misremembered in the mapping area.
			 */
			if (!square_ismark(c, grid)
					&& square_ismemorybad(c, grid)) {
				square_forget(c, grid);
			}
		}
	}

	/* Unmark grids */
	for (y = 1; y < c->height - 1; y++) {
		for (x = 1; x < c->width - 1; x++) {
			struct loc grid = loc(x, y);
			if (!square_in_bounds(c, grid)) continue;
			square_unmark(c, grid);
		}
	}

	/* Fully update the visuals */
	p->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw whole map, monster list */
	p->upkeep->redraw |= (PR_MAP | PR_MONLIST | PR_ITEMLIST);
}